

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4hc.c
# Opt level: O0

int LZ4_compress_HC_extStateHC_fastReset
              (void *state,char *src,char *dst,int srcSize,int dstCapacity,int compressionLevel)

{
  int iVar1;
  size_t alignment;
  LZ4HC_CCtx_internal *ctx;
  int compressionLevel_local;
  int dstCapacity_local;
  int srcSize_local;
  char *dst_local;
  char *src_local;
  void *state_local;
  
  compressionLevel_local = srcSize;
  _dstCapacity_local = dst;
  dst_local = src;
  src_local = (char *)state;
  alignment = LZ4_streamHC_t_alignment();
  iVar1 = LZ4_isAligned(state,alignment);
  if (iVar1 == 0) {
    state_local._4_4_ = 0;
  }
  else {
    LZ4_resetStreamHC_fast((LZ4_streamHC_t *)src_local,compressionLevel);
    LZ4HC_init_internal((LZ4HC_CCtx_internal *)state,(BYTE *)dst_local);
    iVar1 = LZ4_compressBound(compressionLevel_local);
    if (dstCapacity < iVar1) {
      state_local._4_4_ =
           LZ4HC_compress_generic
                     ((LZ4HC_CCtx_internal *)state,dst_local,_dstCapacity_local,
                      &compressionLevel_local,dstCapacity,compressionLevel,limitedOutput);
    }
    else {
      state_local._4_4_ =
           LZ4HC_compress_generic
                     ((LZ4HC_CCtx_internal *)state,dst_local,_dstCapacity_local,
                      &compressionLevel_local,dstCapacity,compressionLevel,notLimited);
    }
  }
  return state_local._4_4_;
}

Assistant:

int LZ4_compress_HC_extStateHC_fastReset (void* state, const char* src, char* dst, int srcSize, int dstCapacity, int compressionLevel)
{
    LZ4HC_CCtx_internal* const ctx = &((LZ4_streamHC_t*)state)->internal_donotuse;
    if (!LZ4_isAligned(state, LZ4_streamHC_t_alignment())) return 0;
    LZ4_resetStreamHC_fast((LZ4_streamHC_t*)state, compressionLevel);
    LZ4HC_init_internal (ctx, (const BYTE*)src);
    if (dstCapacity < LZ4_compressBound(srcSize))
        return LZ4HC_compress_generic (ctx, src, dst, &srcSize, dstCapacity, compressionLevel, limitedOutput);
    else
        return LZ4HC_compress_generic (ctx, src, dst, &srcSize, dstCapacity, compressionLevel, notLimited);
}